

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_xywh.cxx
# Opt level: O3

int Fl::screen_num(int x,int y)

{
  long lVar1;
  
  if (num_screens < 0) {
    screen_init();
  }
  if (0 < num_screens) {
    lVar1 = 0;
    do {
      if ((((screens[lVar1].x_org <= x) &&
           (x < (int)screens[lVar1].width + (int)screens[lVar1].x_org)) &&
          (screens[lVar1].y_org <= y)) &&
         (y < (int)screens[lVar1].height + (int)screens[lVar1].y_org)) goto LAB_001fa1bf;
      lVar1 = lVar1 + 1;
    } while (num_screens != (int)lVar1);
  }
  lVar1 = 0;
LAB_001fa1bf:
  return (int)lVar1;
}

Assistant:

int Fl::screen_num(int x, int y) {
  int screen = 0;
  if (num_screens < 0) screen_init();
  
  for (int i = 0; i < num_screens; i ++) {
    int sx = 0, sy = 0, sw = 0, sh = 0;
    Fl::screen_xywh(sx, sy, sw, sh, i);
    if ((x >= sx) && (x < (sx+sw)) && (y >= sy) && (y < (sy+sh))) {
      screen = i;
      break;
    }
  }
  return screen;
}